

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_isnumber(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  TValue tmp;
  cTValue *o;
  uint6 in_stack_ffffffffffffffd8;
  bool bVar3;
  GCstr *in_stack_ffffffffffffffe0;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  bVar3 = true;
  if ((0xfffeffff < (pTVar2->field_2).it) && (bVar3 = false, (pTVar2->field_2).it == 0xfffffffb)) {
    iVar1 = lj_strscan_num(in_stack_ffffffffffffffe0,
                           (TValue *)CONCAT17(1,(uint7)in_stack_ffffffffffffffd8));
    bVar3 = iVar1 != 0;
  }
  return (int)bVar3;
}

Assistant:

LUA_API int lua_isnumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  return (tvisnumber(o) || (tvisstr(o) && lj_strscan_number(strV(o), &tmp)));
}